

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O0

void __thiscall
TEST_TestMemoryAccountant_countDeallocationsPerSizeMultipleAllocations_TestShell::
~TEST_TestMemoryAccountant_countDeallocationsPerSizeMultipleAllocations_TestShell
          (TEST_TestMemoryAccountant_countDeallocationsPerSizeMultipleAllocations_TestShell *this)

{
  TEST_TestMemoryAccountant_countDeallocationsPerSizeMultipleAllocations_TestShell *this_local;
  
  ~TEST_TestMemoryAccountant_countDeallocationsPerSizeMultipleAllocations_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(TestMemoryAccountant, countDeallocationsPerSizeMultipleAllocations)
{
    accountant.dealloc(8);
    accountant.dealloc(4);
    accountant.dealloc(8);
    LONGS_EQUAL(1, accountant.totalDeallocationsOfSize(4));
    LONGS_EQUAL(2, accountant.totalDeallocationsOfSize(8));
    LONGS_EQUAL(0, accountant.totalDeallocationsOfSize(20));
    LONGS_EQUAL(3, accountant.totalDeallocations());
}